

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  uint id_00;
  uint uVar4;
  REF_STATUS RVar5;
  undefined8 uVar6;
  int iVar7;
  REF_INT node;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  REF_DICT ref_dict;
  REF_INT local;
  REF_DBL area_sign;
  REF_DBL uv [2];
  REF_DBL n [3];
  REF_INT nodes [27];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT local_144;
  REF_DICT local_140;
  FILE *local_138;
  uint local_12c;
  uint local_128;
  int local_124;
  REF_NODE local_120;
  REF_GRID local_118;
  double local_110;
  REF_DBL local_108;
  REF_DBL local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  REF_INT local_d8 [28];
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  local_128 = id;
  uVar4 = ref_dict_create(&local_140);
  id_00 = local_128;
  if (uVar4 == 0) {
    iVar7 = ref_geom->max;
    local_138 = (FILE *)file;
    local_120 = pRVar1;
    local_118 = ref_grid;
    if (0 < iVar7) {
      lVar11 = 0;
      lVar8 = 0;
      do {
        pRVar2 = ref_geom->descr;
        if ((*(int *)((long)pRVar2 + lVar11) == 2) &&
           (*(uint *)((long)pRVar2 + lVar11 + 4) == id_00)) {
          uVar4 = ref_dict_store(local_140,*(REF_INT *)((long)pRVar2 + lVar11 + 0x14),(REF_INT)lVar8
                                );
          if (uVar4 != 0) {
            pcVar9 = "mark nodes";
            uVar6 = 0xd6f;
            goto LAB_0014104c;
          }
          iVar7 = ref_geom->max;
        }
        lVar8 = lVar8 + 1;
        lVar11 = lVar11 + 0x18;
      } while (lVar8 < iVar7);
    }
    if (0 < ref_cell->max) {
      local_12c = local_140->n;
      iVar7 = 0;
      uVar10 = 0;
      do {
        RVar5 = ref_cell_nodes(ref_cell,iVar7,local_d8);
        uVar4 = (int)uVar10 + (uint)(local_d8[3] == id_00 && RVar5 == 0);
        uVar10 = (ulong)uVar4;
        iVar7 = iVar7 + 1;
      } while (iVar7 < ref_cell->max);
      if ((local_12c != 0) && (uVar4 != 0)) {
        fprintf(local_138,"zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)id_00,(ulong)local_12c,uVar10,"point","fetriangle");
        if (local_140->n < 1) {
LAB_0014133b:
          local_144 = -1;
          if (0 < ref_cell->max) {
            iVar7 = 0;
            do {
              RVar5 = ref_cell_nodes(ref_cell,iVar7,local_d8);
              if ((RVar5 == 0) && (local_d8[3] == id_00)) {
                lVar8 = 0;
                do {
                  uVar4 = ref_dict_location(local_140,local_d8[lVar8],&local_124);
                  if (uVar4 != 0) {
                    pcVar9 = "localize";
                    uVar6 = 0xd95;
                    goto LAB_0014104c;
                  }
                  fprintf(local_138," %d",(ulong)(local_124 + 1));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                fputc(10,local_138);
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < ref_cell->max);
          }
          uVar4 = ref_dict_free(local_140);
          if (uVar4 == 0) {
            return 0;
          }
          pcVar9 = "free dict";
          uVar6 = 0xd9c;
        }
        else {
          node = *local_140->key;
          local_144 = *local_140->value;
          uVar4 = ref_geom_find(ref_geom,node,2,id_00,&local_144);
          if (uVar4 == 0) {
            lVar8 = 1;
            do {
              local_108 = ref_geom->param[(long)local_144 * 2];
              local_100 = ref_geom->param[local_144 * 2 + 1];
              uVar4 = ref_geom_face_rsn(ref_geom,id_00,&local_108,local_48,local_68,&local_f8);
              if (uVar4 != 0) {
                pcVar9 = "rsn";
                uVar6 = 0xd8a;
                goto LAB_0014104c;
              }
              uVar4 = ref_geom_uv_area_sign(local_118,id_00,&local_110);
              if (uVar4 != 0) {
                pcVar9 = "a sign";
                uVar6 = 0xd8b;
                goto LAB_0014104c;
              }
              pRVar3 = local_120->real;
              lVar11 = (long)(node * 0xf);
              dVar12 = -local_110;
              fprintf(local_138," %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar3[lVar11],
                      pRVar3[lVar11 + 1],pRVar3[lVar11 + 2],local_f8 * dVar12,local_f0 * dVar12,
                      dVar12 * local_e8);
              if (local_140->n <= lVar8) goto LAB_0014133b;
              node = local_140->key[lVar8];
              local_144 = local_140->value[lVar8];
              uVar4 = ref_geom_find(ref_geom,node,2,id_00,&local_144);
              lVar8 = lVar8 + 1;
            } while (uVar4 == 0);
          }
          pcVar9 = "not found";
          uVar6 = 0xd87;
        }
        goto LAB_0014104c;
      }
    }
    uVar4 = ref_dict_free(local_140);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar9 = "free dict";
    uVar6 = 0xd7d;
  }
  else {
    pcVar9 = "create dict";
    uVar6 = 0xd6a;
  }
LAB_0014104c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
         "ref_geom_norm_tec_zone",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, ntri;
  REF_DBL r[3], s[3], n[3], uv[2];
  REF_DBL area_sign;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
    }
  }
  nnode = ref_dict_n(ref_dict);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    RSS(ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom), "not found");
    uv[0] = ref_geom_param(ref_geom, 0, geom);
    uv[1] = ref_geom_param(ref_geom, 1, geom);
    RSS(ref_geom_face_rsn(ref_geom, id, uv, r, s, n), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e\n",
            ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
            ref_node_xyz(ref_node, 2, node), -area_sign * n[0],
            -area_sign * n[1], -area_sign * n[2]);
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      for (node = 0; node < 3; node++) {
        RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}